

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

int luaG_getfuncline(Proto *f,int pc)

{
  int local_24;
  int local_20;
  int baseline;
  int basepc;
  int pc_local;
  Proto *f_local;
  
  if (f->lineinfo == (ls_byte *)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    baseline = pc;
    _basepc = f;
    local_24 = getbaseline(f,pc,&local_20);
    while (local_20 < baseline) {
      local_24 = _basepc->lineinfo[local_20 + 1] + local_24;
      local_20 = local_20 + 1;
    }
    f_local._4_4_ = local_24;
  }
  return f_local._4_4_;
}

Assistant:

int luaG_getfuncline (const Proto *f, int pc) {
  if (f->lineinfo == NULL)  /* no debug information? */
    return -1;
  else {
    int basepc;
    int baseline = getbaseline(f, pc, &basepc);
    while (basepc++ < pc) {  /* walk until given instruction */
      lua_assert(f->lineinfo[basepc] != ABSLINEINFO);
      baseline += f->lineinfo[basepc];  /* correct line */
    }
    return baseline;
  }
}